

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)9>_> * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::createImage2DAndBindMemory
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,TimestampTestInstance *this,
          VkFormat format,deUint32 width,deUint32 height,VkImageUsageFlags usage,
          VkSampleCountFlagBits sampleCount,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  Allocation *pAVar1;
  Allocation *pAVar2;
  VkResult result;
  int iVar3;
  DeviceInterface *vk;
  VkDevice pVVar4;
  InstanceInterface *pIVar5;
  VkPhysicalDevice pVVar6;
  Move<vk::Handle<(vk::HandleType)9>_> *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VkFormatProperties formatProperty;
  VkImageCreateInfo colorImageParams;
  SimpleAllocator memAlloc;
  deUint32 local_4a4;
  Move<vk::Handle<(vk::HandleType)9>_> *local_4a0;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_498;
  VkDevice local_488;
  undefined1 local_47c [4];
  byte local_478;
  VkMemoryRequirements local_470;
  VkPhysicalDeviceMemoryProperties local_458;
  SimpleAllocator local_250;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar7;
  
  local_4a0 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  local_4a4 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pIVar5 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&local_458,pIVar5,pVVar6);
  local_488 = pVVar4;
  ::vk::SimpleAllocator::SimpleAllocator(&local_250,vk,pVVar4,&local_458);
  pIVar5 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar5->_vptr_InstanceInterface[3])(pIVar5,pVVar6,(ulong)format,local_47c);
  pVVar4 = local_488;
  pMVar7 = local_4a0;
  if (((usage & 0x10) != 0) && ((local_478 & 0x80) == 0)) {
    usage = usage & 0xffffffef;
  }
  local_458.memoryTypes[6].heapIndex = usage;
  if (((usage & 8) != 0) && ((local_478 & 2) == 0)) {
    local_458.memoryTypes[6].heapIndex = usage & 0xfffffff7;
  }
  local_458.memoryTypeCount = 0xe;
  local_458.memoryTypes[0].heapIndex = 0;
  local_458.memoryTypes[1].propertyFlags = 0;
  local_458.memoryTypes[1].heapIndex = 0;
  local_458.memoryTypes[2].propertyFlags = 1;
  local_458.memoryTypes[4].propertyFlags = 1;
  local_458.memoryTypes[4].heapIndex = 1;
  local_458.memoryTypes[5].propertyFlags = 1;
  local_458.memoryTypes[5].heapIndex = sampleCount;
  local_458.memoryTypes[6].propertyFlags = 0;
  local_458.memoryTypes[7].propertyFlags = 0;
  local_458.memoryTypes[7].heapIndex = 1;
  local_458.memoryTypes._68_8_ = &local_4a4;
  local_458.memoryTypes[9].heapIndex = 0;
  local_458.memoryTypes[2].heapIndex = format;
  local_458.memoryTypes[3].propertyFlags = width;
  local_458.memoryTypes[3].heapIndex = height;
  ::vk::createImage(local_4a0,vk,local_488,(VkImageCreateInfo *)&local_458,
                    (VkAllocationCallbacks *)0x0);
  ::vk::getImageMemoryRequirements
            (&local_470,vk,pVVar4,
             (VkImage)(pMVar7->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                      m_internal);
  ::vk::SimpleAllocator::allocate(&local_498,&local_250,&local_470,(MemoryRequirement)0x0);
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,pVVar4,
                      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                      m_internal,
                      ((local_498.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_memory).m_internal,
                      (local_498.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_offset);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(vkDevice, *image, colorImageAlloc->getMemory(), colorImageAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x38f);
  pAVar2 = local_498.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
           ptr;
  local_498.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  pAVar1 = (pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.
           ptr;
  pMVar7 = extraout_RAX;
  if (pAVar1 != pAVar2) {
    if (pAVar1 == (Allocation *)0x0) {
      (pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr =
           pAVar2;
    }
    else {
      iVar3 = (*pAVar1->_vptr_Allocation[1])();
      pMVar7 = (Move<vk::Handle<(vk::HandleType)9>_> *)CONCAT44(extraout_var,iVar3);
      (pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr =
           pAVar2;
      if (local_498.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
          != (Allocation *)0x0) {
        iVar3 = (*(local_498.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                   m_data.ptr)->_vptr_Allocation[1])();
        pMVar7 = (Move<vk::Handle<(vk::HandleType)9>_> *)CONCAT44(extraout_var_00,iVar3);
      }
    }
  }
  return pMVar7;
}

Assistant:

Move<VkImage> TimestampTestInstance::createImage2DAndBindMemory(VkFormat                          format,
																deUint32                          width,
																deUint32                          height,
																VkImageUsageFlags                 usage,
																VkSampleCountFlagBits             sampleCount,
																de::details::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();
	const deUint32              queueFamilyIndex    = m_context.getUniversalQueueFamilyIndex();
	SimpleAllocator             memAlloc            (vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));

	// Optimal tiling feature check
	VkFormatProperties          formatProperty;
	m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), format, &formatProperty);
	if((usage & VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT) && !(formatProperty.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
	{
		// Remove color attachment usage if the optimal tiling feature does not support it
		usage &= ~VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
	}
	if((usage & VK_IMAGE_USAGE_STORAGE_BIT) && !(formatProperty.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
	{
		// Remove storage usage if the optimal tiling feature does not support it
		usage &= ~VK_IMAGE_USAGE_STORAGE_BIT;
	}

	const VkImageCreateInfo colorImageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,                                        // VkStructureType      sType;
		DE_NULL,                                                                    // const void*          pNext;
		0u,                                                                         // VkImageCreateFlags   flags;
		VK_IMAGE_TYPE_2D,                                                           // VkImageType          imageType;
		format,                                                                     // VkFormat             format;
		{ width, height, 1u },                                                      // VkExtent3D           extent;
		1u,                                                                         // deUint32             mipLevels;
		1u,                                                                         // deUint32             arraySize;
		sampleCount,                                                                // deUint32             samples;
		VK_IMAGE_TILING_OPTIMAL,                                                    // VkImageTiling        tiling;
		usage,                                                                      // VkImageUsageFlags    usage;
		VK_SHARING_MODE_EXCLUSIVE,                                                  // VkSharingMode        sharingMode;
		1u,                                                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex,                                                          // const deUint32*      pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,                                                  // VkImageLayout        initialLayout;
	};

	Move<VkImage> image = createImage(vk, vkDevice, &colorImageParams);

	// Allocate and bind image memory
	de::MovePtr<Allocation> colorImageAlloc = memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any);
	VK_CHECK(vk.bindImageMemory(vkDevice, *image, colorImageAlloc->getMemory(), colorImageAlloc->getOffset()));

	DE_ASSERT(pAlloc);
	*pAlloc = colorImageAlloc;

	return image;
}